

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest_tests.cpp
# Opt level: O0

void __thiscall txrequest_tests::TxRequestTest::test_method(TxRequestTest *this)

{
  long lVar1;
  long in_FS_OFFSET;
  int i;
  TxRequestTest *in_stack_000000e0;
  undefined4 local_14;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_14 = 0; local_14 < 5; local_14 = local_14 + 1) {
    anon_unknown.dwarf_d715c4::TxRequestTest::TestInterleavedScenarios(in_stack_000000e0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(TxRequestTest)
{
    for (int i = 0; i < 5; ++i) {
        TestInterleavedScenarios();
    }
}